

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_result.cpp
# Opt level: O0

value __thiscall cpp_db::sqlite_result::get_column_value(sqlite_result *this,int column)

{
  undefined4 uVar1;
  int iVar2;
  uchar *__first;
  char *__s;
  undefined4 in_EDX;
  _Storage extraout_RDX;
  _Storage extraout_RDX_00;
  _Storage extraout_RDX_01;
  _Storage extraout_RDX_02;
  _Storage extraout_RDX_03;
  _Storage _Var3;
  undefined4 in_register_00000034;
  value vVar4;
  null_type local_a0;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<unsigned_char> local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  uchar *local_40;
  uint8_t *data;
  long local_30;
  sqlite3_stmt *local_28;
  sqlite3_stmt *pstmt;
  sqlite_result *psStack_18;
  int column_local;
  sqlite_result *this_local;
  
  psStack_18 = (sqlite_result *)CONCAT44(in_register_00000034,column);
  pstmt._4_4_ = in_EDX;
  this_local = this;
  local_28 = get_stmt_handle(psStack_18);
  uVar1 = sqlite3_column_type(local_28,pstmt._4_4_);
  switch(uVar1) {
  case 1:
    local_30 = sqlite3_column_int64(local_28,pstmt._4_4_);
    std::any::any<long,long,std::any::_Manager_internal<long>,void>((any *)this,&local_30);
    _Var3 = extraout_RDX;
    break;
  case 2:
    data = (uint8_t *)sqlite3_column_double(local_28,pstmt._4_4_);
    std::any::any<double,double,std::any::_Manager_internal<double>,void>
              ((any *)this,(double *)&data);
    _Var3 = extraout_RDX_00;
    break;
  case 3:
    __s = (char *)sqlite3_column_text(local_28,pstmt._4_4_);
    iVar2 = sqlite3_column_bytes(local_28,pstmt._4_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,__s,(long)iVar2,&local_91);
    std::any::
    any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
              ((any *)this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    _Var3 = extraout_RDX_02;
    break;
  case 4:
    __first = (uchar *)sqlite3_column_blob(local_28,pstmt._4_4_);
    local_40 = __first;
    iVar2 = sqlite3_column_bytes(local_28,pstmt._4_4_);
    std::allocator<unsigned_char>::allocator(&local_59);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,__first,
               __first + iVar2,&local_59);
    std::any::
    any<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::any::_Manager_external<std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((any *)this,&local_58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_58);
    std::allocator<unsigned_char>::~allocator(&local_59);
    _Var3 = extraout_RDX_01;
    break;
  case 5:
  default:
    null_type::null_type(&local_a0);
    std::any::
    any<cpp_db::null_type,cpp_db::null_type,std::any::_Manager_internal<cpp_db::null_type>,void>
              ((any *)this,&local_a0);
    _Var3 = extraout_RDX_03;
  }
  vVar4._M_storage._M_ptr = _Var3._M_ptr;
  vVar4._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)this;
  return vVar4;
}

Assistant:

value sqlite_result::get_column_value(int column) const
{
	sqlite3_stmt *pstmt = get_stmt_handle();

    switch (sqlite3_column_type(pstmt, column))
    {
    case SQLITE_INTEGER:	// int64
        return static_cast<int64_t>(sqlite3_column_int64(pstmt, column));
    case SQLITE_FLOAT:		// double
        return sqlite3_column_double(pstmt, column);
    case SQLITE_BLOB:		// void *
    {
        const uint8_t *data = static_cast<const uint8_t*>(sqlite3_column_blob(pstmt, column));
        return blob(data, data + sqlite3_column_bytes(pstmt, column));
    }
    case SQLITE_TEXT:		// const char *
        return std::string(reinterpret_cast<const char *>(sqlite3_column_text(pstmt, column))
                           , static_cast<size_t>(sqlite3_column_bytes(pstmt, column)));
    case SQLITE_NULL:		//
    default:
        break;
    }
    return null_type();
}